

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

JSON_VALUE * json_parse(char *input)

{
  uint uVar1;
  JSON_VALUE *pJVar2;
  size_t sVar3;
  void *pvVar4;
  char *pcVar5;
  JSON_VALUE **ppJVar6;
  char cVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  anon_union_24_3_9b40ff73_for_data *paVar17;
  bool bVar18;
  JSON_VALUE *stack [8];
  JSON_VALUE *local_a0;
  char *local_90;
  JSON_VALUE *local_78 [9];
  
  sVar3 = strlen(input);
  if (sVar3 == 0) {
    return local_78[0];
  }
  iVar8 = 0;
  uVar14 = 0;
LAB_00103641:
  local_90 = (char *)0x0;
  local_a0 = (JSON_VALUE *)0x0;
  pcVar5 = local_90;
LAB_00103658:
  do {
    local_90 = pcVar5;
    uVar12 = uVar14;
    bVar13 = input[uVar12];
    pvVar4 = memchr(" \t\r\n",(int)(char)bVar13,5);
    uVar11 = uVar12 + 1;
    uVar14 = uVar11;
    pcVar5 = local_90;
  } while (pvVar4 != (void *)0x0);
  if (bVar13 == 0x22) {
    pcVar5 = (char *)0x0;
    uVar14 = 0;
    sVar10 = 0;
    do {
      cVar7 = input[uVar11];
      if (cVar7 == '\\') {
        bVar13 = input[uVar11 + 1];
        lVar16 = 2;
        if (0x6d < bVar13) {
          if (bVar13 == 0x74) {
            cVar7 = '\t';
          }
          else if (bVar13 == 0x72) {
            cVar7 = '\r';
          }
          else {
            if (bVar13 != 0x6e) goto LAB_001036d3;
            cVar7 = '\n';
          }
          goto LAB_001036a0;
        }
        if (bVar13 == 0x22) {
          cVar7 = '\"';
          goto LAB_001036a0;
        }
        if (bVar13 == 0x5c) {
          cVar7 = '\\';
          goto LAB_001036a0;
        }
      }
      else {
        if (cVar7 == '\"') goto LAB_00103716;
        lVar16 = 1;
LAB_001036a0:
        if (sVar10 <= uVar14) {
          bVar18 = sVar10 == 0;
          sVar10 = sVar10 * 2;
          if (bVar18) {
            sVar10 = 8;
          }
          pcVar5 = (char *)realloc(pcVar5,sVar10);
        }
        pcVar5[uVar14] = cVar7;
        uVar14 = uVar14 + 1;
      }
LAB_001036d3:
      uVar11 = uVar11 + lVar16;
    } while( true );
  }
  if (bVar13 < 0x6e) {
    if (bVar13 < 0x5d) {
      if (bVar13 == 0x2c) goto LAB_001038b5;
      if (bVar13 == 0x5b) {
        local_a0 = (JSON_VALUE *)malloc(0x20);
        *(undefined8 *)local_a0 = 0;
        (local_a0->data).str = (char *)0x0;
        (local_a0->data).obj.values = (JSON_VALUE **)0x0;
        *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
        local_a0->type = JSON_ARRAY;
        goto LAB_001038b5;
      }
    }
    else {
      if (bVar13 == 0x5d) {
LAB_0010388a:
        iVar8 = iVar8 + -1;
        goto LAB_001038b5;
      }
      if (bVar13 == 0x66) {
        local_a0 = (JSON_VALUE *)malloc(0x20);
        *(undefined8 *)local_a0 = 0;
        (local_a0->data).str = (char *)0x0;
        (local_a0->data).obj.values = (JSON_VALUE **)0x0;
        *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
        local_a0->type = JSON_FALSE;
        uVar11 = uVar12 + 5;
        goto LAB_001038b5;
      }
    }
  }
  else if (bVar13 < 0x7b) {
    if (bVar13 == 0x6e) {
      local_a0 = (JSON_VALUE *)malloc(0x20);
      uVar11 = uVar12 + 4;
      *(undefined8 *)local_a0 = 0;
      (local_a0->data).str = (char *)0x0;
      (local_a0->data).obj.values = (JSON_VALUE **)0x0;
      *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
      goto LAB_001038b5;
    }
    if (bVar13 == 0x74) {
      local_a0 = (JSON_VALUE *)malloc(0x20);
      *(undefined8 *)local_a0 = 0;
      (local_a0->data).str = (char *)0x0;
      (local_a0->data).obj.values = (JSON_VALUE **)0x0;
      *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
      local_a0->type = JSON_TRUE;
      uVar11 = uVar12 + 4;
      goto LAB_001038b5;
    }
  }
  else {
    if (bVar13 == 0x7d) goto LAB_0010388a;
    if (bVar13 == 0x7b) {
      local_a0 = (JSON_VALUE *)malloc(0x20);
      *(undefined8 *)local_a0 = 0;
      (local_a0->data).str = (char *)0x0;
      (local_a0->data).obj.values = (JSON_VALUE **)0x0;
      *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
      local_a0->type = JSON_OBJECT;
      goto LAB_001038b5;
    }
  }
  pvVar4 = memchr(" \t\r\n,]}",(int)(char)bVar13,8);
  if (pvVar4 == (void *)0x0) {
    uVar11 = 0;
    pcVar5 = (char *)0x0;
    uVar14 = 0;
    do {
      sVar10 = uVar14;
      if (uVar14 <= uVar11) {
        sVar10 = uVar14 * 2;
        if (uVar14 == 0) {
          sVar10 = 8;
        }
        pcVar5 = (char *)realloc(pcVar5,sVar10);
      }
      pcVar5[uVar11] = bVar13;
      uVar11 = uVar11 + 1;
      bVar13 = input[uVar12 + 1];
      uVar12 = uVar12 + 1;
      pvVar4 = memchr(" \t\r\n,]}",(int)(char)bVar13,8);
      uVar14 = sVar10;
    } while (pvVar4 == (void *)0x0);
  }
  else {
    pcVar5 = (char *)0x0;
    uVar11 = 0;
    sVar10 = 0;
  }
  if (sVar10 <= uVar11) {
    sVar9 = sVar10 * 2;
    if (sVar10 == 0) {
      sVar9 = 8;
    }
    pcVar5 = (char *)realloc(pcVar5,sVar9);
  }
  pcVar5[uVar11] = '\0';
  local_a0 = (JSON_VALUE *)malloc(0x20);
  *(undefined8 *)local_a0 = 0;
  (local_a0->data).str = (char *)0x0;
  (local_a0->data).obj.values = (JSON_VALUE **)0x0;
  *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
  local_a0->type = JSON_STRING;
  (local_a0->data).str = pcVar5;
  uVar11 = uVar12;
  goto LAB_001038b5;
LAB_00103716:
  if (sVar10 <= uVar14) {
    sVar9 = sVar10 * 2;
    if (sVar10 == 0) {
      sVar9 = 8;
    }
    pcVar5 = (char *)realloc(pcVar5,sVar9);
  }
  pcVar5[uVar14] = '\0';
  uVar14 = uVar11 + 1;
  do {
    uVar11 = uVar14;
    cVar7 = input[uVar11];
    pvVar4 = memchr(" \t\r\n",(int)cVar7,5);
    uVar14 = uVar11 + 1;
  } while (pvVar4 != (void *)0x0);
  if (cVar7 != ':') goto LAB_0010376e;
  goto LAB_00103658;
LAB_0010376e:
  local_a0 = (JSON_VALUE *)malloc(0x20);
  *(undefined8 *)local_a0 = 0;
  (local_a0->data).str = (char *)0x0;
  (local_a0->data).obj.values = (JSON_VALUE **)0x0;
  *(undefined8 *)((long)&local_a0->data + 0x10) = 0;
  local_a0->type = JSON_STRING;
  (local_a0->data).str = pcVar5;
LAB_001038b5:
  uVar14 = uVar11 - 1;
  do {
    pvVar4 = memchr(" \t\r\n",(int)input[uVar14 + 1],5);
    uVar14 = uVar14 + 1;
  } while (pvVar4 != (void *)0x0);
  if (local_a0 == (JSON_VALUE *)0x0) goto LAB_001039d8;
  if (0 < iVar8) {
    pJVar2 = local_78[iVar8 - 1];
    if (local_90 == (char *)0x0) {
      if (pJVar2->type == JSON_ARRAY) {
        paVar17 = &pJVar2->data;
        puVar15 = &(pJVar2->data).array.n;
        uVar1 = (pJVar2->data).array.alloced;
        if (uVar1 <= (pJVar2->data).array.n) {
          uVar11 = (ulong)(uVar1 * 2);
          if (uVar1 == 0) {
            uVar11 = 4;
          }
          (pJVar2->data).array.alloced = (uint)uVar11;
          pcVar5 = (char *)realloc((pJVar2->data).str,uVar11 << 5);
          (pJVar2->data).str = pcVar5;
        }
        goto LAB_00103992;
      }
    }
    else if (pJVar2->type == JSON_OBJECT) {
      uVar1 = (pJVar2->data).obj.alloced;
      if (uVar1 <= (pJVar2->data).obj.n) {
        uVar11 = (ulong)(uVar1 * 2);
        if (uVar1 == 0) {
          uVar11 = 4;
        }
        (pJVar2->data).obj.alloced = (uint)uVar11;
        pcVar5 = (char *)realloc((pJVar2->data).str,uVar11 << 3);
        (pJVar2->data).str = pcVar5;
        ppJVar6 = (JSON_VALUE **)
                  realloc((pJVar2->data).obj.values,(ulong)(pJVar2->data).obj.alloced << 5);
        (pJVar2->data).obj.values = ppJVar6;
      }
      puVar15 = &(pJVar2->data).obj.n;
      *(char **)((pJVar2->data).str + (ulong)(pJVar2->data).obj.n * 8) = local_90;
      paVar17 = (anon_union_24_3_9b40ff73_for_data *)&(pJVar2->data).obj.values;
LAB_00103992:
      *(JSON_VALUE **)((long)paVar17->str + (ulong)*puVar15 * 8) = local_a0;
      *puVar15 = *puVar15 + 1;
    }
  }
  if ((local_a0->type == JSON_OBJECT) || (iVar8 == 0 || local_a0->type == JSON_ARRAY)) {
    local_78[iVar8] = local_a0;
    iVar8 = iVar8 + 1;
  }
LAB_001039d8:
  if (sVar3 <= uVar14) {
    return local_78[0];
  }
  goto LAB_00103641;
}

Assistant:

JSON_VALUE*
json_parse(const char* input)
{
    off_t off = 0;
    size_t len;
    JSON_VALUE* stack[8];
    int stack_top = 0;

    len = strlen(input);

    while(off < len) {
        char* key = NULL;
        JSON_VALUE* v = NULL;

after_key:
        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        switch(input[off]) {
            case '{':
                v = json_alloc_value(JSON_OBJECT);
                off++;
                break;

            case '[':
                v = json_alloc_value(JSON_ARRAY);
                off++;
                break;

            case 'n':
                v = json_alloc_value(JSON_NULL);
                off += strlen("null");
                break;

            case 'f':
                v = json_alloc_value(JSON_FALSE);
                off += strlen("false");
                break;

            case 't':
                v = json_alloc_value(JSON_TRUE);
                off += strlen("true");
                break;

            case ']':
            case '}':
                off++;
                stack_top--;
                break;

            case ',':
                off++;
                break;

            case '"':
            {
                char* str;

                off = json_create_string(input, off, &str);

                while(strchr(" \t\r\n", input[off]) != NULL)
                    off++;
                if(input[off] == ':') {
                    off++;
                    key = str;
                    goto after_key;
                } else {
                    v = json_alloc_value(JSON_STRING);
                    v->data.str = str;
                }
                break;
            }

            default:
            {
                char* str;

                off = json_create_unqoted_string(input, off, &str);
                v = json_alloc_value(JSON_STRING);
                v->data.str = str;
                break;
            }
        }

        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        if(v != NULL) {
            if(stack_top > 0)
                json_add_value(stack[stack_top-1], key, v);

            if(v->type == JSON_OBJECT || v->type == JSON_ARRAY || stack_top == 0) {
                stack[stack_top] = v;
                stack_top++;
            }
        }
    }

    return stack[0];
}